

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O0

int archive_read_append_filter(archive *_a,int code)

{
  int iVar1;
  void *pvVar2;
  int local_6c;
  archive_read *a;
  archive_read_filter *filter;
  archive_read_filter_bidder *bidder;
  char str [20];
  int local_2c;
  int i;
  int number_bidders;
  int r2;
  int r1;
  int code_local;
  archive *_a_local;
  
  switch(code) {
  case 0:
    number_bidders = 0;
    break;
  case 1:
    strcpy((char *)&bidder,"gzip");
    number_bidders = archive_read_support_filter_gzip(_a);
    break;
  case 2:
    strcpy((char *)&bidder,"bzip2");
    number_bidders = archive_read_support_filter_bzip2(_a);
    break;
  case 3:
    strcpy((char *)&bidder,"compress (.Z)");
    number_bidders = archive_read_support_filter_compress(_a);
    break;
  case 4:
    archive_set_error(_a,0x16,"Cannot append program filter using archive_read_append_filter");
    return -0x1e;
  case 5:
    strcpy((char *)&bidder,"lzma");
    number_bidders = archive_read_support_filter_lzma(_a);
    break;
  case 6:
    strcpy((char *)&bidder,"xz");
    number_bidders = archive_read_support_filter_xz(_a);
    break;
  case 7:
    strcpy((char *)&bidder,"uu");
    number_bidders = archive_read_support_filter_uu(_a);
    break;
  case 8:
    strcpy((char *)&bidder,"rpm");
    number_bidders = archive_read_support_filter_rpm(_a);
    break;
  case 9:
    strcpy((char *)&bidder,"lzip");
    number_bidders = archive_read_support_filter_lzip(_a);
    break;
  case 10:
    strcpy((char *)&bidder,"lrzip");
    number_bidders = archive_read_support_filter_lrzip(_a);
    break;
  case 0xb:
    strcpy((char *)&bidder,"lzop");
    number_bidders = archive_read_support_filter_lzop(_a);
    break;
  default:
    archive_set_error(_a,0x16,"Invalid filter code specified");
    return -0x1e;
  case 0xd:
    strcpy((char *)&bidder,"lz4");
    number_bidders = archive_read_support_filter_lz4(_a);
    break;
  case 0xe:
    strcpy((char *)&bidder,"zstd");
    number_bidders = archive_read_support_filter_zstd(_a);
  }
  if (code != 0) {
    filter = (archive_read_filter *)&_a[1].read_data_offset;
    local_2c = 1;
    while (((local_2c < 0x10 && (filter->bidder != (archive_read_filter_bidder *)0x0)) &&
           (iVar1 = strcmp((char *)filter->bidder,(char *)&bidder), iVar1 != 0))) {
      local_2c = local_2c + 1;
      filter = (archive_read_filter *)&filter->archive;
    }
    if ((filter->bidder == (archive_read_filter_bidder *)0x0) ||
       (iVar1 = strcmp((char *)filter->bidder,(char *)&bidder), iVar1 != 0)) {
      archive_set_error(_a,0x16,"Internal error: Unable to append filter");
      return -0x1e;
    }
    pvVar2 = calloc(1,0x90);
    if (pvVar2 == (void *)0x0) {
      archive_set_error(_a,0xc,"Out of memory");
      return -0x1e;
    }
    *(archive_read_filter **)((long)pvVar2 + 8) = filter;
    *(archive **)((long)pvVar2 + 0x18) = _a;
    *(size_t *)((long)pvVar2 + 0x10) = _a[4].error_string.length;
    _a[4].error_string.length = (size_t)pvVar2;
    iVar1 = (*(code *)filter->upstream->bidder)(_a[4].error_string.length);
    if (iVar1 != 0) {
      __archive_read_free_filters((archive_read *)_a);
      return -0x1e;
    }
  }
  *(undefined4 *)&_a[4].error_string.buffer_length = 1;
  if (number_bidders < 0) {
    local_6c = number_bidders;
  }
  else {
    local_6c = 0;
  }
  return local_6c;
}

Assistant:

int
archive_read_append_filter(struct archive *_a, int code)
{
  int r1, r2, number_bidders, i;
  char str[20];
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  r2 = (ARCHIVE_OK);
  switch (code)
  {
    case ARCHIVE_FILTER_NONE:
      /* No filter to add, so do nothing.
       * NOTE: An initial "NONE" type filter is always set at the end of the
       * filter chain.
       */
      r1 = (ARCHIVE_OK);
      break;
    case ARCHIVE_FILTER_GZIP:
      strcpy(str, "gzip");
      r1 = archive_read_support_filter_gzip(_a);
      break;
    case ARCHIVE_FILTER_BZIP2:
      strcpy(str, "bzip2");
      r1 = archive_read_support_filter_bzip2(_a);
      break;
    case ARCHIVE_FILTER_COMPRESS:
      strcpy(str, "compress (.Z)");
      r1 = archive_read_support_filter_compress(_a);
      break;
    case ARCHIVE_FILTER_PROGRAM:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Cannot append program filter using archive_read_append_filter");
      return (ARCHIVE_FATAL);
    case ARCHIVE_FILTER_LZMA:
      strcpy(str, "lzma");
      r1 = archive_read_support_filter_lzma(_a);
      break;
    case ARCHIVE_FILTER_XZ:
      strcpy(str, "xz");
      r1 = archive_read_support_filter_xz(_a);
      break;
    case ARCHIVE_FILTER_UU:
      strcpy(str, "uu");
      r1 = archive_read_support_filter_uu(_a);
      break;
    case ARCHIVE_FILTER_RPM:
      strcpy(str, "rpm");
      r1 = archive_read_support_filter_rpm(_a);
      break;
    case ARCHIVE_FILTER_LZ4:
      strcpy(str, "lz4");
      r1 = archive_read_support_filter_lz4(_a);
      break;
    case ARCHIVE_FILTER_ZSTD:
      strcpy(str, "zstd");
      r1 = archive_read_support_filter_zstd(_a);
      break;
    case ARCHIVE_FILTER_LZIP:
      strcpy(str, "lzip");
      r1 = archive_read_support_filter_lzip(_a);
      break;
    case ARCHIVE_FILTER_LZOP:
      strcpy(str, "lzop");
      r1 = archive_read_support_filter_lzop(_a);
      break;
    case ARCHIVE_FILTER_LRZIP:
      strcpy(str, "lrzip");
      r1 = archive_read_support_filter_lrzip(_a);
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid filter code specified");
      return (ARCHIVE_FATAL);
  }

  if (code != ARCHIVE_FILTER_NONE)
  {
    number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

    bidder = a->bidders;
    for (i = 1; i < number_bidders; i++, bidder++)
    {
      if (!bidder->name || !strcmp(bidder->name, str))
        break;
    }
    if (!bidder->name || strcmp(bidder->name, str))
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Internal error: Unable to append filter");
      return (ARCHIVE_FATAL);
    }

    filter = calloc(1, sizeof(*filter));
    if (filter == NULL)
    {
      archive_set_error(&a->archive, ENOMEM, "Out of memory");
      return (ARCHIVE_FATAL);
    }
    filter->bidder = bidder;
    filter->archive = a;
    filter->upstream = a->filter;
    a->filter = filter;
    r2 = (bidder->vtable->init)(a->filter);
    if (r2 != ARCHIVE_OK) {
      __archive_read_free_filters(a);
      return (ARCHIVE_FATAL);
    }
  }

  a->bypass_filter_bidding = 1;
  return (r1 < r2) ? r1 : r2;
}